

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

int lj_trace_exit(jit_State *J,void *exptr)

{
  char cVar1;
  int iVar2;
  int iVar3;
  lua_State *L;
  TValue *pTVar4;
  uint64_t uVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  ptrdiff_t argbase;
  long lVar9;
  byte bVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  TValue TVar14;
  ulong uVar15;
  ExitDataCP exd;
  jit_State *local_48;
  void *local_40;
  BCIns *local_38;
  
  piVar8 = __errno_location();
  iVar2 = *piVar8;
  L = J->L;
  iVar3 = J->exitcode;
  if (iVar3 == 0) {
    TVar14.u64 = 0xffffffffffffffff;
  }
  else {
    J->exitcode = 0;
    TVar14 = L->top[-1];
  }
  local_48 = J;
  local_40 = exptr;
  iVar7 = lj_vm_cpcall(L,0,&local_48,trace_exit_cp);
  if (iVar7 == 0) {
    if (iVar3 != 0) {
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      *pTVar4 = TVar14;
    }
    uVar5 = (L->glref).ptr64;
    if (((-1 < *(char *)(uVar5 + 0x91)) && ((*(byte *)(uVar5 + 0x93) & 8) != 0)) &&
       (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TEXIT), argbase != 0)) {
      if ((long)((L->maxstack).ptr64 - (long)L->top) < 0x1c1) {
        lj_state_growstack(L,0x38);
      }
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      pTVar4->n = (double)(int)J->parent;
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      pTVar4->n = (double)(int)J->exitno;
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      pTVar4->u64 = 0x4030000000000000;
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      pTVar4->u64 = 0x4030000000000000;
      lVar9 = 0;
      do {
        lVar6 = *(long *)((long)exptr + lVar9 * 8 + 0x80);
        pTVar4 = L->top;
        L->top = pTVar4 + 1;
        pTVar4->n = (double)lVar6;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      lVar9 = 0;
      do {
        *L->top = *(TValue *)((long)exptr + lVar9 * 8);
        if (NAN(L->top->n)) {
          L->top->u64 = 0xfff8000000000000;
        }
        L->top = L->top + 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      lj_vmevent_call(L,argbase);
    }
    uVar15 = (ulong)L->cframe & 0xfffffffffffffffc;
    *(BCIns **)(uVar15 + 0x18) = local_38;
    if (iVar3 == 0) {
      uVar5 = (L->glref).ptr64;
      bVar10 = *(byte *)(uVar5 + 0x91);
      if (-1 < (char)bVar10) {
        cVar1 = *(char *)(uVar5 + 0x21);
        if ((cVar1 == '\x05') || (cVar1 == '\x02')) {
          if (bVar10 < 0x40) {
            lj_gc_step(L);
          }
        }
        else if (((J[-1].penalty[0x2d].val & 0x6000) == 0) &&
                (*(char *)((J->L->base[-2].u64 & 0x7fffffffffff) + 10) == '\0')) {
          lVar9 = *(long *)(J->trace[J->parent].gcptr64 + 0x30);
          cVar1 = *(char *)(lVar9 + 0xb + (ulong)J->exitno * 0xc);
          if ((cVar1 != -1) &&
             (bVar10 = cVar1 + 1, *(byte *)(lVar9 + (ulong)J->exitno * 0xc + 0xb) = bVar10,
             J->param[7] <= (int)(uint)bVar10)) {
            J->state = LJ_TRACE_START;
            lj_trace_ins(J,local_38);
          }
        }
      }
      uVar13 = *local_38;
      if ((char)uVar13 == 'W') {
        uVar5 = J->trace[uVar13 >> 0x10].gcptr64;
        bVar10 = *(byte *)(uVar5 + 0x50);
        uVar12 = bVar10 - 0x49;
        if ((uVar12 < 4) || (bVar10 == 0x46)) {
          puVar11 = (uint *)(uVar5 + 0x50);
          if (J->state == LJ_TRACE_RECORD) {
            J->patchins = uVar13;
            J->patchpc = local_38;
            *local_38 = *puVar11;
            J->bcskip = '\x01';
          }
          else if (uVar12 < 4) {
            *(uint **)(uVar15 + 0x18) = puVar11;
            local_38 = puVar11;
          }
        }
      }
      *piVar8 = iVar2;
      uVar12 = *local_38;
      uVar13 = (uVar12 & 0xff) - 0x3f;
      uVar13 = uVar13 >> 1 | (uint)((uVar13 & 1) != 0) << 0x1f;
      if (uVar13 - 1 < 2) {
        iVar7 = ~((uVar12 >> 0x10 & 0xff) + (uVar12 >> 8 & 0xff)) +
                (int)((ulong)((long)L->top - (long)L->base) >> 3);
      }
      else {
        if (uVar13 == 0) {
          iVar7 = (int)((ulong)((long)L->top - (long)L->base) >> 3) - (uVar12 >> 8 & 0xff);
        }
        else {
          if (uVar13 != 5) {
            if ((uVar12 & 0xff) < 0x59) {
              return 0;
            }
            return (int)((ulong)((long)L->top - (long)L->base) >> 3) + 1;
          }
          iVar7 = (int)((ulong)((long)L->top - (long)L->base) >> 3) -
                  ((uVar12 >> 0x10) + (uVar12 >> 8 & 0xff));
        }
        iVar7 = iVar7 + 1;
      }
    }
    else {
      iVar7 = -iVar3;
    }
  }
  else {
    iVar7 = -iVar7;
  }
  return iVar7;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode, exitcode = J->exitcode;
  TValue exiterr;
  const BCIns *pc;
  void *cf;
  GCtrace *T;

  setnilV(&exiterr);
  if (exitcode) {  /* Trace unwound with error code. */
    J->exitcode = 0;
    copyTV(L, &exiterr, L->top-1);
  }

#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lj_assertJ(T->root != 0, "stack check in root trace");
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lj_assertJ(T != NULL && J->exitno < T->nsnap, "bad trace or exit number");
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  if (exitcode) copyTV(L, L->top++, &exiterr);  /* Anchor the error object. */

  if (!(LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)))
    lj_vmevent_send(L, TEXIT,
      lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
      trace_exit_regs(L, ex);
    );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (exitcode) {
    return -exitcode;
  } else if (LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)) {
    /* Just exit to interpreter. */
  } else if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC))
      lj_gc_step(L);  /* Exited because of GC: drive GC forward. */
  } else {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    int isret = bc_isret(bc_op(*retpc));
    if (isret || bc_op(*retpc) == BC_ITERN) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else if (isret) {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
#ifdef LUA_USE_TRACE_LOGS
  lj_log_trace_normal_exit(L, (int) T->traceno, pc);
#endif
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc) - LJ_FR2);
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}